

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QLayoutParameter<double>_>::erase
          (QMovableArrayOps<QLayoutParameter<double>_> *this,QLayoutParameter<double> *b,qsizetype n
          )

{
  QLayoutParameter<double> *__src;
  QArrayDataPointer<QLayoutParameter<double>_> *pQVar1;
  QLayoutParameter<double> *pQVar2;
  long in_RDX;
  QArrayDataPointer<QLayoutParameter<double>_> *in_RSI;
  long in_RDI;
  QLayoutParameter<double> *e;
  QLayoutParameter<double> *in_stack_ffffffffffffffa8;
  QArrayDataPointer<QLayoutParameter<double>_> *in_stack_ffffffffffffffb0;
  
  __src = (QLayoutParameter<double> *)(&in_RSI->d + in_RDX * 2);
  std::destroy<QLayoutParameter<double>*>
            ((QLayoutParameter<double> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pQVar1 = (QArrayDataPointer<QLayoutParameter<double>_> *)
           QArrayDataPointer<QLayoutParameter<double>_>::begin
                     ((QArrayDataPointer<QLayoutParameter<double>_> *)0x8b39aa);
  if ((in_RSI == pQVar1) &&
     (pQVar2 = QArrayDataPointer<QLayoutParameter<double>_>::end(in_stack_ffffffffffffffb0),
     __src != pQVar2)) {
    *(QLayoutParameter<double> **)(in_RDI + 8) = __src;
  }
  else {
    pQVar2 = QArrayDataPointer<QLayoutParameter<double>_>::end(in_stack_ffffffffffffffb0);
    if (__src != pQVar2) {
      pQVar2 = QArrayDataPointer<QLayoutParameter<double>_>::end(in_RSI);
      memmove(in_RSI,__src,((long)pQVar2 - (long)__src >> 4) << 4);
    }
  }
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - in_RDX;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;

        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.

        std::destroy(b, e);
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            memmove(static_cast<void *>(b), static_cast<const void *>(e), (static_cast<const T *>(this->end()) - e)*sizeof(T));
        }
        this->size -= n;
    }